

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

double traverse_itree<PredictionData<double,long>,long,ImputedData<long,double>>
                 (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
                 PredictionData<double,_long> *prediction_data,
                 vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
                 ImputedData<long,_double> *imputed_data,double curr_weight,size_t row,
                 long *tree_num,double *tree_depth,size_t curr_lev)

{
  NewCategAction NVar1;
  MissingAction MVar2;
  pointer pcVar3;
  pointer pcVar4;
  double dVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  size_t *psVar10;
  pointer pIVar11;
  uint uVar12;
  size_t curr_lev_00;
  pointer pIVar13;
  size_t *psVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  if (prediction_data->Xr_indptr == (long *)0x0) {
    if (prediction_data->Xc_indptr == (long *)0x0) {
      uVar8 = (uint)prediction_data->is_col_major;
    }
    else {
      uVar8 = 3;
    }
  }
  else {
    uVar8 = 2;
  }
  pIVar11 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pIVar13 = pIVar11 + curr_lev;
  curr_lev_00 = pIVar11[curr_lev].tree_left;
  if (curr_lev_00 != 0) {
    psVar14 = &pIVar11[curr_lev].tree_left;
    sVar17 = curr_lev;
    do {
      curr_lev = sVar17;
      if (pIVar13->col_type == Categorical) {
        psVar10 = &prediction_data->ncols_categ;
        sVar6 = row;
        sVar7 = pIVar13->col_num;
        if (prediction_data->is_col_major != false) {
          psVar10 = &prediction_data->nrows;
          sVar6 = pIVar13->col_num;
          sVar7 = row;
        }
        uVar12 = prediction_data->categ_data[sVar6 * *psVar10 + sVar7];
        uVar9 = (ulong)(int)uVar12;
        if ((long)uVar9 < 0) {
          MVar2 = model_outputs->missing_action;
          if (MVar2 == Impute) {
            if (pIVar13->pct_tree_left < 0.5) {
              psVar14 = &pIVar13->tree_right;
            }
LAB_0014a63f:
            curr_lev = *psVar14;
          }
          else {
            if (MVar2 == Fail) {
              return NAN;
            }
            if (MVar2 == Divide) goto LAB_0014a70d;
          }
        }
        else if (model_outputs->cat_split_type == SubSet) {
          pcVar3 = (pIVar13->cat_split).
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar4 = *(pointer *)
                    ((long)&(pIVar13->cat_split).
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                    8);
          if (pcVar3 == pcVar4) {
            if (uVar12 < 2) {
              psVar10 = &pIVar13->tree_right;
              if (uVar12 == 0) {
                psVar10 = psVar14;
              }
              curr_lev = *psVar10;
            }
            else {
              if (model_outputs->new_cat_action == Smallest) {
LAB_0014a66c:
                psVar10 = &pIVar13->tree_right;
                if (pIVar13->pct_tree_left <= 0.5 && pIVar13->pct_tree_left != 0.5) {
                  psVar10 = psVar14;
                }
                goto LAB_0014a4e4;
              }
              if (model_outputs->new_cat_action == Weighted) goto LAB_0014a70d;
            }
          }
          else {
            NVar1 = model_outputs->new_cat_action;
            iVar15 = (int)pcVar3;
            iVar16 = (int)pcVar4;
            if (NVar1 != Weighted) {
              if (NVar1 == Smallest) {
                if (iVar16 - iVar15 <= (int)uVar12) goto LAB_0014a66c;
              }
              else {
                if (NVar1 != Random) goto LAB_0014a5e4;
                if (iVar16 - iVar15 <= (int)uVar12) {
                  uVar12 = (int)uVar12 % (iVar16 - iVar15);
                }
                uVar9 = (ulong)uVar12;
              }
              if (pcVar3[uVar9] == '\0') {
                psVar14 = &pIVar13->tree_right;
              }
              goto LAB_0014a63f;
            }
            if (iVar16 - iVar15 <= (int)uVar12) {
LAB_0014a70d:
              if (tree_num == (long *)0x0 && tree_depth == (double *)0x0) {
                dVar18 = pIVar11[sVar17].pct_tree_left;
                dVar19 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,double>>
                                   (tree,model_outputs,prediction_data,impute_nodes,imputed_data,
                                    dVar18 * curr_weight,row,(long *)0x0,(double *)0x0,curr_lev_00);
                pIVar13 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                dVar5 = 1.0 - pIVar13[sVar17].pct_tree_left;
                dVar20 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,double>>
                                   (tree,model_outputs,prediction_data,impute_nodes,imputed_data,
                                    curr_weight * dVar5,row,(long *)0x0,(double *)0x0,
                                    pIVar13[sVar17].tree_right);
                return (dVar19 * dVar18 + dVar20 * dVar5) - 0.0;
              }
              throw_unsupported_pred_error();
            }
            if (pcVar3[uVar9] == '\0') {
              curr_lev = pIVar13->tree_right;
            }
            else {
              curr_lev = curr_lev_00;
              if (pcVar3[uVar9] == -1) goto LAB_0014a70d;
            }
          }
        }
        else if (model_outputs->cat_split_type == SingleCateg) {
          psVar10 = &pIVar13->tree_right;
          if (uVar12 == pIVar13->chosen_cat) {
            psVar10 = psVar14;
          }
LAB_0014a4e4:
          curr_lev = *psVar10;
        }
      }
      else if (pIVar13->col_type == Numeric) {
        dVar18 = (double)(*(code *)(&DAT_0036e4ac + *(int *)(&DAT_0036e4ac + (ulong)uVar8 * 4)))();
        return dVar18;
      }
LAB_0014a5e4:
      pIVar13 = pIVar11 + curr_lev;
      psVar14 = &pIVar11[curr_lev].tree_left;
      curr_lev_00 = *psVar14;
      sVar17 = curr_lev;
    } while (curr_lev_00 != 0);
  }
  if (tree_num != (long *)0x0) {
    tree_num[row] = curr_lev;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = pIVar13->score;
  }
  if (imputed_data != (ImputedData<long,_double> *)0x0) {
    add_from_impute_node<ImputedData<long,double>>
              ((impute_nodes->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start + curr_lev,imputed_data,curr_weight);
    pIVar11 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  return pIVar11[curr_lev].score - 0.0;
}

Assistant:

double traverse_itree(std::vector<IsoTree>     &tree,
                      IsoForest                &model_outputs,
                      PredictionData           &prediction_data,
                      std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                      ImputedData             *imputed_data,     /* only when imputing missing */
                      double                   curr_weight,      /* only when imputing missing */
                      size_t                   row,
                      sparse_ix *restrict      tree_num,
                      double *restrict         tree_depth,
                      size_t                   curr_lev)
{
    double xval;
    int    cval;
    double range_penalty = 0;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
    }

    while (true)
    {
        // if (tree[curr_lev].score >= 0.)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            if (unlikely(imputed_data != NULL))
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, curr_weight);

            return tree[curr_lev].score - range_penalty;
        }

        else
        {
            switch(tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    switch(numeric_config)
                    {
                        case DenseRowMajor:
                        {
                            xval = prediction_data.numeric_data[tree[curr_lev].col_num + row * prediction_data.ncols_numeric];
                            break;
                        }

                        case DenseColMajor:
                        {
                            xval = prediction_data.numeric_data[row +  tree[curr_lev].col_num * prediction_data.nrows];
                            break;
                        }

                        case SparseCSR:
                        {
                            xval = extract_spR(prediction_data, row_st, row_end, tree[curr_lev].col_num);
                            break;
                        }

                        case SparseCSC:
                        {
                            xval = extract_spC(prediction_data, row, tree[curr_lev].col_num);
                            break;
                        }
                    }

                    if (unlikely(std::isnan(xval)))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        range_penalty += (xval < tree[curr_lev].range_low) || (xval > tree[curr_lev].range_high);
                        curr_lev = (xval <= tree[curr_lev].num_split)?
                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    }
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    if (unlikely(cval < 0))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        switch(model_outputs.cat_split_type)
                        {
                            case SingleCateg:
                            {
                                curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case SubSet:
                            {

                                if (tree[curr_lev].cat_split.empty())
                                {
                                    if (cval <= 1)
                                    {
                                        curr_lev = (cval == 0)?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                    }

                                    else
                                    {
                                        switch(model_outputs.new_cat_action)
                                        {
                                            case Smallest:
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                                break;
                                            }

                                            case Weighted:
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            default:
                                            {
                                                assert(0);
                                                break;
                                            }
                                        }
                                    }
                                }

                                else
                                {
                                    switch(model_outputs.new_cat_action)
                                    {
                                        case Random:
                                        {
                                            cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                    (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            break;
                                        }

                                        case Smallest:
                                        {
                                            if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }

                                        case Weighted:
                                        {
                                            if (cval >= (int)tree[curr_lev].cat_split.size()
                                                    ||
                                                tree[curr_lev].cat_split[cval] == (-1))
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }
                                    }
                                }
                                break;
                            }
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}